

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

int reconstructSeeds(tree_t *tree,uint16_t *hideList,size_t hideListSize,uint8_t *input,
                    size_t inputLen,uint8_t *salt,uint repIndex,picnic_instance_t *params)

{
  uint i_00;
  size_t sVar1;
  uint *__ptr;
  size_t __n;
  int iVar2;
  size_t i;
  size_t sVar3;
  size_t revealedSize;
  
  revealedSize = 0;
  __ptr = getRevealedNodes(tree,hideList,hideListSize,&revealedSize);
  sVar1 = revealedSize;
  iVar2 = -1;
  if (__ptr != (uint *)0x0) {
    __n = (size_t)params->seed_size;
    if (revealedSize * __n < inputLen || revealedSize * __n - inputLen == 0) {
      for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
        i_00 = __ptr[sVar3];
        memcpy(tree->nodes + i_00 * (int)__n,input,__n);
        markNode(tree,i_00);
        __n = (size_t)params->seed_size;
        input = input + __n;
      }
      expandSeeds(tree,salt,repIndex,params);
      iVar2 = 0;
    }
  }
  free(__ptr);
  return iVar2;
}

Assistant:

int reconstructSeeds(tree_t* tree, uint16_t* hideList, size_t hideListSize, uint8_t* input,
                     size_t inputLen, uint8_t* salt, unsigned int repIndex,
                     const picnic_instance_t* params) {
  int ret                = -1;
  size_t revealedSize    = 0;
  unsigned int* revealed = getRevealedNodes(tree, hideList, hideListSize, &revealedSize);
  if (!revealed || inputLen < revealedSize * params->seed_size) {
    goto Exit;
  }

  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(&tree->nodes[revealed[i] * params->seed_size], input, params->seed_size);
    markNode(tree, revealed[i]);
    input += params->seed_size;
  }

  expandSeeds(tree, salt, repIndex, params);
  ret = 0;

Exit:
  free(revealed);
  return ret;
}